

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
kratos::Port::Port(Port *this,Generator *module,PortDirection direction,string *name,uint32_t width,
                  vector<unsigned_int,_std::allocator<unsigned_int>_> *size,PortType type,
                  bool is_signed)

{
  UserException *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar1;
  format_args args;
  string_view format_str;
  string local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  byte local_c9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_c8;
  bool is_signed_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  string *psStack_b8;
  uint32_t width_local;
  string *name_local;
  Generator *pGStack_a8;
  PortDirection direction_local;
  Generator *module_local;
  Port *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  local_c9 = is_signed;
  this_01 = &local_e8;
  pvStack_c8 = size;
  size_local._4_4_ = width;
  psStack_b8 = name;
  name_local._4_4_ = direction;
  pGStack_a8 = module;
  module_local = (Generator *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_01,size);
  aVar1._0_4_ = local_c9 & 1;
  aVar1._4_4_ = 0;
  Var::Var(&this->super_Var,module,name,width,this_01,SUB41(aVar1._0_4_,0),PortIO);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00590800;
  this->direction_ = name_local._4_4_;
  this->type_ = type;
  std::optional<bool>::optional(&this->active_high_);
  if (((((type == AsyncReset) || (type == Clock)) || (type == ClockEnable)) || (type == Reset)) &&
     (1 < size_local._4_4_)) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_38 = &local_118;
    local_40 = "{0}\'s width has be 1, got {1}";
    local_48 = psStack_b8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)((long)&size_local + 4);
    fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_int&,char[30],char>
              (&local_78,(v7 *)"{0}\'s width has be 1, got {1}",(char (*) [30])psStack_b8,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,
               (remove_reference_t<unsigned_int_&> *)this_01);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x2d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar1.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_118,(detail *)local_88.data_,format_str,args);
    UserException::UserException(this_00,&local_118);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  return;
}

Assistant:

Port::Port(kratos::Generator* module, kratos::PortDirection direction, const std::string& name,
           uint32_t width, const std::vector<uint32_t>& size, kratos::PortType type, bool is_signed)
    : Var(module, name, width, size, is_signed, VarType::PortIO),
      direction_(direction),
      type_(type) {
    if ((type == PortType::AsyncReset || type == PortType::Clock || type == PortType::ClockEnable ||
         type == PortType::Reset) &&
        width > 1) {
        throw UserException(::format("{0}'s width has be 1, got {1}", name, width));
    }
}